

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.cpp
# Opt level: O2

void __thiscall CheckStructure::check(CheckStructure *this,string *x)

{
  int iVar1;
  string *ch;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  iVar1 = this->m_countCalls;
  this->m_countCalls = iVar1 + 1;
  switch(iVar1) {
  case 0:
    ch = &local_30;
    std::__cxx11::string::string((string *)ch,(string *)x);
    isType(this,ch);
    break;
  case 1:
    ch = &local_50;
    std::__cxx11::string::string((string *)ch,(string *)x);
    isMain(this,ch);
    break;
  case 2:
    ch = &local_70;
    std::__cxx11::string::string((string *)ch,(string *)x);
    isOpenedPar(this,ch);
    break;
  case 3:
    ch = &local_90;
    std::__cxx11::string::string((string *)ch,(string *)x);
    isClosedPar(this,ch);
    break;
  case 4:
    ch = &local_b0;
    std::__cxx11::string::string((string *)ch,(string *)x);
    isOpenedBody(this,ch);
    break;
  case 5:
    ch = &local_d0;
    std::__cxx11::string::string((string *)ch,(string *)x);
    isReturn(this,ch);
    break;
  case 6:
    ch = &local_f0;
    std::__cxx11::string::string((string *)ch,(string *)x);
    isTypeOfReturnValue(this,ch);
    break;
  case 7:
    ch = &local_110;
    std::__cxx11::string::string((string *)ch,(string *)x);
    isClosedStatement(this,ch);
    break;
  case 8:
    ch = &local_130;
    std::__cxx11::string::string((string *)ch,(string *)x);
    isClosedBody(this,ch);
    break;
  default:
    goto switchD_00103d84_default;
  }
  std::__cxx11::string::~string((string *)ch);
switchD_00103d84_default:
  return;
}

Assistant:

void CheckStructure::check(string x) {
    m_countCalls++;
    switch (m_countCalls) {
        case 1:
            isType(x);
            break;
        case 2:
            isMain(x);
            break;
        case 3:
            isOpenedPar(x);
            break;
        case 4:
            isClosedPar(x);
            break;
        case 5:
            isOpenedBody(x);
            break;
        case 6:
            isReturn(x);
            break;
        case 7:
            isTypeOfReturnValue(x);
            break;
        case 8:
            isClosedStatement(x);
            break;
        case 9:
            isClosedBody(x);
            break;
        default:
            break;
    }
}